

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JasmineTest.cpp
# Opt level: O0

int openInDefaultBrowser(string_view port,string_view file)

{
  int iVar1;
  _If_sv<std::basic_string_view<char>,_basic_string<char>_&> this;
  _If_sv<std::basic_string_view<char>,_basic_string<char>_&> this_00;
  char *__command;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> url;
  string command;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff18;
  basic_string_view<char,_std::char_traits<char>_> *__svt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator<char> *__a;
  char *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_99 [2];
  allocator<char> local_41 [65];
  
  __a = local_41;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,__a);
  std::allocator<char>::~allocator(local_41);
  __lhs = local_99;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,__a);
  this = std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                   (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  __svt = (basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff3f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,__a);
  this_00 = std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                      (this,__svt);
  std::operator+(__lhs,this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff3f);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  std::allocator<char>::~allocator((allocator<char> *)local_99);
  webfront::http::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
  append(this_00,in_stack_ffffffffffffff08);
  __command = webfront::http::std::__cxx11::
              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x108d78);
  iVar1 = system(__command);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(iVar1,in_stack_ffffffffffffff00));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(iVar1,in_stack_ffffffffffffff00));
  return iVar1;
}

Assistant:

auto openInDefaultBrowser(std::string_view port, std::string_view file) {
#ifdef _WIN32
    auto command = std::string("start ");
#elif __linux__
    auto command = std::string("xdg-open ");
#elif __APPLE__
    auto command = std::string("open ");
#endif

    auto url = std::string("http://localhost:").append(port) + std::string("/").append(file);
    return ::system(command.append(url).c_str());
}